

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_find_files.cpp
# Opt level: O2

bool __thiscall
crnlib::find_files::find_internal
          (find_files *this,char *pBasepath,char *pRelpath,char *pFilespec,uint flags,int level)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  DIR *__dirp;
  dirent *pdVar5;
  char *pcVar6;
  long lVar7;
  file_desc *pfVar8;
  ulong uVar9;
  bool bVar10;
  dynamic_string filename;
  dynamic_string pathname;
  dynamic_string_array paths;
  dynamic_string local_40;
  
  pathname.m_buf_size = 0;
  pathname.m_len = 0;
  pathname.m_pStr = (char *)0x0;
  if (*pRelpath == '\0') {
    dynamic_string::operator=(&pathname,pBasepath);
  }
  else {
    file_utils::combine_path(&pathname,pBasepath,pRelpath);
  }
  if ((pathname.m_len != 0) && (pathname.m_pStr[pathname.m_len - 1] != '/')) {
    dynamic_string::append(&pathname,"/");
  }
  pcVar6 = pathname.m_pStr;
  if (pathname.m_pStr == (char *)0x0) {
    pcVar6 = "";
  }
  __dirp = opendir(pcVar6);
  if (__dirp == (DIR *)0x0) {
    bVar10 = level != 0;
  }
  else {
    paths.m_p = (dynamic_string *)0x0;
    paths.m_size = 0;
    paths.m_capacity = 0;
    while( true ) {
      pdVar5 = readdir(__dirp);
      if (pdVar5 == (dirent *)0x0) break;
      if ((pdVar5->d_name[0] != '.') ||
         ((pdVar5->d_name[1] != '\0' && ((pdVar5->d_name[1] != '.' || (pdVar5->d_name[2] != '\0'))))
         )) {
        bVar1 = pdVar5->d_type;
        dynamic_string::dynamic_string(&filename,pdVar5->d_name);
        if (((flags & 1) != 0) && ((bVar1 & 4) != 0)) {
          vector<crnlib::dynamic_string>::push_back(&paths,&filename);
        }
        if (((byte)((byte)flags >> 2 & (byte)((bVar1 & 8) >> 3)) != 0) ||
           ((flags & 2) != 0 && (bVar1 & 4) != 0)) {
          pcVar6 = filename.m_pStr;
          if (filename.m_pStr == (char *)0x0) {
            pcVar6 = "";
          }
          iVar3 = fnmatch(pFilespec,pcVar6,0);
          if (iVar3 == 0) {
            vector<crnlib::find_files::file_desc>::resize
                      (&this->m_files,(this->m_files).m_size + 1,false);
            pfVar8 = (this->m_files).m_p;
            uVar4 = (this->m_files).m_size - 1;
            pfVar8[uVar4].m_is_dir = SUB41((bVar1 & 4) >> 2,0);
            dynamic_string::operator=(&pfVar8[uVar4].m_base,pBasepath);
            pfVar8 = pfVar8 + uVar4;
            dynamic_string::operator=(&pfVar8->m_rel,pRelpath);
            dynamic_string::operator=(&pfVar8->m_name,&filename);
            operator+((crnlib *)&local_40,&pathname,&filename);
            dynamic_string::operator=(&pfVar8->m_fullname,&local_40);
            dynamic_string::~dynamic_string(&local_40);
          }
        }
        dynamic_string::~dynamic_string(&filename);
      }
    }
    closedir(__dirp);
    bVar10 = true;
    if ((flags & 1) != 0) {
      uVar9 = 0xffffffffffffffff;
      lVar7 = 0;
      do {
        uVar9 = uVar9 + 1;
        bVar10 = (paths._8_8_ & 0xffffffff) <= uVar9;
        if (bVar10) break;
        filename.m_buf_size = 0;
        filename.m_len = 0;
        filename.m_pStr = (char *)0x0;
        if (*pRelpath == '\0') {
          dynamic_string::operator=
                    (&filename,(dynamic_string *)((long)&(paths.m_p)->m_buf_size + lVar7));
        }
        else {
          pcVar6 = *(char **)((long)&(paths.m_p)->m_pStr + lVar7);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = "";
          }
          file_utils::combine_path(&filename,pRelpath,pcVar6);
        }
        pcVar6 = filename.m_pStr;
        if (filename.m_pStr == (char *)0x0) {
          pcVar6 = "";
        }
        bVar2 = find_internal(this,pBasepath,pcVar6,pFilespec,flags,level + 1);
        lVar7 = lVar7 + 0x10;
        dynamic_string::~dynamic_string(&filename);
      } while (bVar2);
    }
    vector<crnlib::dynamic_string>::~vector(&paths);
  }
  dynamic_string::~dynamic_string(&pathname);
  return bVar10;
}

Assistant:

bool find_files::find_internal(const char* pBasepath, const char* pRelpath, const char* pFilespec, uint flags, int level)
    {
        dynamic_string pathname;
        if (strlen(pRelpath))
        {
            file_utils::combine_path(pathname, pBasepath, pRelpath);
        }
        else
        {
            pathname = pBasepath;
        }

        if (!pathname.is_empty())
        {
            char c = pathname.back();
            if (c != '/')
            {
                pathname += "/";
            }
        }

        DIR* dp = opendir(pathname.get_ptr());

        if (!dp)
        {
            return level ? true : false;
        }

        dynamic_string_array paths;

        for (;;)
        {
            struct dirent* ep = readdir(dp);
            if (!ep)
            {
                break;
            }
            if ((strcmp(ep->d_name, ".") == 0) || (strcmp(ep->d_name, "..") == 0))
            {
                continue;
            }

            const bool is_directory = (ep->d_type & DT_DIR) != 0;
            const bool is_file = (ep->d_type & DT_REG) != 0;

            dynamic_string filename(ep->d_name);

            if (is_directory)
            {
                if (flags & cFlagRecursive)
                {
                    paths.push_back(filename);
                }
            }

            if (((is_file) && (flags & cFlagAllowFiles)) || ((is_directory) && (flags & cFlagAllowDirs)))
            {
                if (0 == fnmatch(pFilespec, filename.get_ptr(), 0))
                {
                    m_files.resize(m_files.size() + 1);
                    file_desc& file = m_files.back();
                    file.m_is_dir = is_directory;
                    file.m_base = pBasepath;
                    file.m_rel = pRelpath;
                    file.m_name = filename;
                    file.m_fullname = pathname + filename;
                }
            }
        }

        closedir(dp);
        dp = nullptr;

        if (flags & cFlagRecursive)
        {
            for (uint i = 0; i < paths.size(); i++)
            {
                dynamic_string childpath;
                if (strlen(pRelpath))
                {
                    file_utils::combine_path(childpath, pRelpath, paths[i].get_ptr());
                }
                else
                {
                    childpath = paths[i];
                }

                if (!find_internal(pBasepath, childpath.get_ptr(), pFilespec, flags, level + 1))
                {
                    return false;
                }
            }
        }

        return true;
    }